

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_crypto_aes(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t regno;
  uint32_t regno_00;
  TCGv_ptr arg;
  TCGv_ptr arg_00;
  TCGv_i32 arg_01;
  code *local_58;
  CryptoThreeOpIntFn *genfn;
  TCGv_i32 tcg_decrypt;
  TCGv_ptr tcg_rn_ptr;
  TCGv_ptr tcg_rd_ptr;
  int decrypt;
  int rd;
  int rn;
  int opcode;
  int size;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0x16,2);
  uVar3 = extract32(insn,0xc,5);
  regno = extract32(insn,5,5);
  regno_00 = extract32(insn,0,5);
  _Var1 = isar_feature_aa64_aes(s->isar);
  if ((_Var1) && (uVar2 == 0)) {
    switch(uVar3) {
    case 4:
      tcg_rd_ptr._4_4_ = 0;
      local_58 = gen_helper_crypto_aese;
      break;
    case 5:
      tcg_rd_ptr._4_4_ = 1;
      local_58 = gen_helper_crypto_aese;
      break;
    case 6:
      tcg_rd_ptr._4_4_ = 0;
      local_58 = gen_helper_crypto_aesmc;
      break;
    case 7:
      tcg_rd_ptr._4_4_ = 1;
      local_58 = gen_helper_crypto_aesmc;
      break;
    default:
      unallocated_encoding_aarch64(s);
      return;
    }
    _Var1 = fp_access_check(s);
    if (_Var1) {
      arg = vec_full_reg_ptr(s,regno_00);
      arg_00 = vec_full_reg_ptr(s,regno);
      arg_01 = tcg_const_i32_aarch64(tcg_ctx_00,tcg_rd_ptr._4_4_);
      (*local_58)(tcg_ctx_00,arg,arg_00,arg_01);
      tcg_temp_free_ptr(tcg_ctx_00,arg);
      tcg_temp_free_ptr(tcg_ctx_00,arg_00);
      tcg_temp_free_i32(tcg_ctx_00,arg_01);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_crypto_aes(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int decrypt;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    TCGv_i32 tcg_decrypt;
    CryptoThreeOpIntFn *genfn;

    if (!dc_isar_feature(aa64_aes, s) || size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x4: /* AESE */
        decrypt = 0;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x6: /* AESMC */
        decrypt = 0;
        genfn = gen_helper_crypto_aesmc;
        break;
    case 0x5: /* AESD */
        decrypt = 1;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x7: /* AESIMC */
        decrypt = 1;
        genfn = gen_helper_crypto_aesmc;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_decrypt = tcg_const_i32(tcg_ctx, decrypt);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_decrypt);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_i32(tcg_ctx, tcg_decrypt);
}